

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

void __thiscall QTreeView::mouseDoubleClickEvent(QTreeView *this,QMouseEvent *event)

{
  undefined1 uVar1;
  bool bVar2;
  byte bVar3;
  State SVar4;
  int iVar5;
  int iVar6;
  QTreeViewPrivate *this_00;
  const_reference pQVar7;
  ulong uVar8;
  QStyle *pQVar9;
  long lVar10;
  qsizetype qVar11;
  QWidget *pQVar12;
  undefined8 in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  int i;
  QTreeViewPrivate *d;
  QPersistentModelIndex persistent;
  QPersistentModelIndex firstColumnIndex;
  QWidget *in_stack_fffffffffffffe98;
  QAbstractItemViewPrivate *in_stack_fffffffffffffea0;
  QTreeViewPrivate *in_stack_fffffffffffffeb0;
  undefined6 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebe;
  undefined1 uVar13;
  undefined1 in_stack_fffffffffffffebf;
  undefined1 in_stack_fffffffffffffedb;
  undefined4 in_stack_fffffffffffffedc;
  uint item;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  QTreeViewPrivate *pQVar14;
  int in_stack_ffffffffffffff04;
  QTreeViewPrivate *in_stack_ffffffffffffff08;
  QPersistentModelIndex local_e8 [3];
  QPersistentModelIndex local_d0 [3];
  QPersistentModelIndex local_b8 [3];
  QPointF local_a0;
  QPoint local_90;
  undefined1 local_88 [24];
  QPersistentModelIndex local_70;
  QPersistentModelIndex local_68;
  QPointF local_60;
  QPoint local_50;
  QPointF local_48;
  QPoint local_38;
  QPointF local_30;
  QPoint local_20;
  QRect local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QTreeView *)0x8f91d5);
  SVar4 = QAbstractItemView::state((QAbstractItemView *)in_stack_fffffffffffffea0);
  item = CONCAT13(1,(int3)in_stack_fffffffffffffedc);
  if (SVar4 == NoState) {
    local_18 = QWidget::rect((QWidget *)
                             CONCAT17(in_stack_fffffffffffffebf,
                                      CONCAT16(in_stack_fffffffffffffebe,in_stack_fffffffffffffeb8))
                            );
    local_30 = QSinglePointEvent::position((QSinglePointEvent *)0x8f921c);
    local_20 = QPointF::toPoint((QPointF *)in_stack_fffffffffffffeb0);
    uVar1 = QRect::contains((QPoint *)&local_18,SUB81(&local_20,0));
    item = CONCAT13(uVar1,(int3)item) ^ 0xff000000;
  }
  if ((item & 0x1000000) != 0) goto LAB_008f9726;
  local_48 = QSinglePointEvent::position((QSinglePointEvent *)0x8f9283);
  local_38 = QPointF::toPoint((QPointF *)in_stack_fffffffffffffeb0);
  iVar5 = QTreeViewPrivate::itemDecorationAt
                    (this_00,(QPoint *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0)
                    );
  if (iVar5 != -1) goto LAB_008f9726;
  local_60 = QSinglePointEvent::position((QSinglePointEvent *)0x8f92df);
  local_50 = QPointF::toPoint((QPointF *)in_stack_fffffffffffffeb0);
  QPoint::y((QPoint *)0x8f9313);
  iVar5 = QTreeViewPrivate::itemAtCoordinate(in_stack_ffffffffffffff08,in_stack_ffffffffffffff04);
  if (iVar5 == -1) goto LAB_008f9726;
  local_68.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar7 = QList<QTreeViewItem>::at
                     ((QList<QTreeViewItem> *)in_stack_fffffffffffffea0,
                      (qsizetype)in_stack_fffffffffffffe98);
  QPersistentModelIndex::QPersistentModelIndex(&local_68,(QModelIndex *)pQVar7);
  local_70.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
  local_a0 = QSinglePointEvent::position((QSinglePointEvent *)0x8f937d);
  local_90 = QPointF::toPoint((QPointF *)in_stack_fffffffffffffeb0);
  (**(code **)(*in_RDI + 0x1f0))(local_88,in_RDI,&local_90);
  QPersistentModelIndex::QPersistentModelIndex(&local_70,(QModelIndex *)local_88);
  bVar2 = ::operator!=((QPersistentModelIndex *)in_stack_fffffffffffffea0,
                       (QPersistentModelIndex *)in_stack_fffffffffffffe98);
  if (bVar2) {
    (**(code **)(*in_RDI + 0x98))(in_RDI,in_RSI);
  }
  else {
    QPersistentModelIndex::operator_cast_to_QModelIndex(local_b8);
    QAbstractItemView::doubleClicked
              ((QAbstractItemView *)in_stack_fffffffffffffea0,
               (QModelIndex *)in_stack_fffffffffffffe98);
    uVar8 = QPersistentModelIndex::isValid();
    if ((uVar8 & 1) != 0) {
      QPersistentModelIndex::operator_cast_to_QModelIndex(local_d0);
      bVar3 = (**(code **)(*in_RDI + 0x2e0))(in_RDI,local_d0,2,in_RSI);
      uVar1 = true;
      if ((bVar3 & 1) == 0) {
        SVar4 = QAbstractItemView::state((QAbstractItemView *)in_stack_fffffffffffffea0);
        uVar1 = SVar4 != NoState;
      }
      if ((bool)uVar1 == false) {
        pQVar9 = QWidget::style(in_stack_fffffffffffffe98);
        iVar6 = (**(code **)(*(long *)pQVar9 + 0xf0))(pQVar9,0x3d,0,in_RDI);
        if (iVar6 == 0) {
          QPersistentModelIndex::operator_cast_to_QModelIndex(local_e8);
          QAbstractItemView::activated
                    ((QAbstractItemView *)in_stack_fffffffffffffea0,
                     (QModelIndex *)in_stack_fffffffffffffe98);
        }
        (this_00->super_QAbstractItemViewPrivate).releaseFromDoubleClick = true;
        QAbstractItemViewPrivate::executePostedLayout(in_stack_fffffffffffffea0);
        uVar13 = false;
        pQVar14 = this_00;
        if (((this_00->itemsExpandable & 1U) != 0) &&
           (uVar13 = false, (this_00->expandsOnDoubleClick & 1U) != 0)) {
          QPersistentModelIndex::operator_cast_to_QModelIndex
                    ((QPersistentModelIndex *)&stack0xffffffffffffff00);
          uVar13 = QTreeViewPrivate::hasVisibleChildren
                             ((QTreeViewPrivate *)
                              CONCAT17(uVar1,CONCAT16(uVar13,in_stack_fffffffffffffeb8)),
                              (QModelIndex *)this_00);
          in_stack_fffffffffffffeb0 = this_00;
        }
        if ((bool)uVar13 != false) {
          lVar10 = (long)iVar5;
          qVar11 = QList<QTreeViewItem>::size(&pQVar14->viewItems);
          if (lVar10 < qVar11) {
            QList<QTreeViewItem>::at
                      ((QList<QTreeViewItem> *)in_stack_fffffffffffffea0,
                       (qsizetype)in_stack_fffffffffffffe98);
            bVar2 = ::operator==((QModelIndex *)in_stack_fffffffffffffea0,
                                 (QPersistentModelIndex *)in_stack_fffffffffffffe98);
            if (!bVar2) goto LAB_008f95ec;
          }
          else {
LAB_008f95ec:
            iVar5 = 0;
            while( true ) {
              in_stack_fffffffffffffea0 = (QAbstractItemViewPrivate *)(long)iVar5;
              qVar11 = QList<QTreeViewItem>::size(&pQVar14->viewItems);
              if (qVar11 <= (long)in_stack_fffffffffffffea0) break;
              QList<QTreeViewItem>::at
                        ((QList<QTreeViewItem> *)in_stack_fffffffffffffea0,
                         (qsizetype)in_stack_fffffffffffffe98);
              bVar2 = ::operator==((QModelIndex *)in_stack_fffffffffffffea0,
                                   (QPersistentModelIndex *)in_stack_fffffffffffffe98);
              if (bVar2) break;
              iVar5 = iVar5 + 1;
            }
            in_stack_fffffffffffffe98 = (QWidget *)(long)iVar5;
            pQVar12 = (QWidget *)QList<QTreeViewItem>::size(&pQVar14->viewItems);
            if (in_stack_fffffffffffffe98 == pQVar12) goto LAB_008f96fe;
          }
          pQVar7 = QList<QTreeViewItem>::at
                             ((QList<QTreeViewItem> *)in_stack_fffffffffffffea0,
                              (qsizetype)in_stack_fffffffffffffe98);
          if ((*(ulong *)&pQVar7->field_0x1c & 1) == 0) {
            QTreeViewPrivate::expand
                      (in_stack_fffffffffffffeb0,(int)((ulong)lVar10 >> 0x20),
                       SUB81((ulong)lVar10 >> 0x18,0));
          }
          else {
            QTreeViewPrivate::collapse
                      ((QTreeViewPrivate *)CONCAT44(iVar5,in_stack_fffffffffffffee0),item,
                       (bool)in_stack_fffffffffffffedb);
          }
          (**(code **)(*in_RDI + 0x268))();
          QAbstractScrollArea::viewport((QAbstractScrollArea *)in_stack_fffffffffffffea0);
          QWidget::update(in_stack_fffffffffffffe98);
        }
      }
    }
  }
LAB_008f96fe:
  QPersistentModelIndex::~QPersistentModelIndex(&local_70);
  QPersistentModelIndex::~QPersistentModelIndex(&local_68);
LAB_008f9726:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeView::mouseDoubleClickEvent(QMouseEvent *event)
{
    Q_D(QTreeView);
    if (state() != NoState || !d->viewport->rect().contains(event->position().toPoint()))
        return;

    int i = d->itemDecorationAt(event->position().toPoint());
    if (i == -1) {
        i = d->itemAtCoordinate(event->position().toPoint().y());
        if (i == -1)
            return; // user clicked outside the items

        const QPersistentModelIndex firstColumnIndex = d->viewItems.at(i).index;
        const QPersistentModelIndex persistent = indexAt(event->position().toPoint());

        if (d->pressedIndex != persistent) {
            mousePressEvent(event);
            return;
        }

        // signal handlers may change the model
        emit doubleClicked(persistent);

        if (!persistent.isValid())
            return;

        if (edit(persistent, DoubleClicked, event) || state() != NoState)
            return; // the double click triggered editing

        if (!style()->styleHint(QStyle::SH_ItemView_ActivateItemOnSingleClick, nullptr, this))
            emit activated(persistent);

        d->releaseFromDoubleClick = true;
        d->executePostedLayout(); // we need to make sure viewItems is updated
        if (d->itemsExpandable
            && d->expandsOnDoubleClick
            && d->hasVisibleChildren(persistent)) {
            if (!((i < d->viewItems.size()) && (d->viewItems.at(i).index == firstColumnIndex))) {
                // find the new index of the item
                for (i = 0; i < d->viewItems.size(); ++i) {
                    if (d->viewItems.at(i).index == firstColumnIndex)
                        break;
                }
                if (i == d->viewItems.size())
                    return;
            }
            if (d->viewItems.at(i).expanded)
                d->collapse(i, true);
            else
                d->expand(i, true);
            updateGeometries();
            viewport()->update();
        }
    }
}